

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_setRoot(char *archive,char *subdir)

{
  int iVar1;
  size_t sVar2;
  char *dst;
  __PHYSFS_DIRHANDLE__ *p_Var3;
  ulong uVar4;
  
  if (archive == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
LAB_00107c2d:
    iVar1 = 0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    for (p_Var3 = searchPath; p_Var3 != (DirHandle *)0x0; p_Var3 = p_Var3->next) {
      if (p_Var3->dirName != (char *)0x0) {
        iVar1 = strcmp(archive,p_Var3->dirName);
        if (iVar1 == 0) {
          if ((subdir == (char *)0x0) || ((*subdir == '/' && (subdir[1] == '\0')))) {
            if (p_Var3->root != (char *)0x0) {
              (*__PHYSFS_AllocatorHooks.Free)(p_Var3->root);
            }
            p_Var3->root = (char *)0x0;
            p_Var3->rootlen = 0;
            break;
          }
          sVar2 = strlen(subdir);
          uVar4 = sVar2 + 1;
          dst = (char *)(*__PHYSFS_AllocatorHooks.Malloc)(uVar4);
          if (dst == (char *)0x0) {
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          }
          else {
            iVar1 = sanitizePlatformIndependentPath(subdir,dst);
            if (iVar1 != 0) {
              if (p_Var3->root != (char *)0x0) {
                (*__PHYSFS_AllocatorHooks.Free)(p_Var3->root);
              }
              p_Var3->root = dst;
              p_Var3->rootlen = uVar4;
              if (longest_root < uVar4) {
                longest_root = uVar4;
              }
              break;
            }
            (*__PHYSFS_AllocatorHooks.Free)(dst);
          }
          __PHYSFS_platformReleaseMutex(stateLock);
          goto LAB_00107c2d;
        }
      }
    }
    __PHYSFS_platformReleaseMutex(stateLock);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int PHYSFS_setRoot(const char *archive, const char *subdir)
{
    DirHandle *i;

    BAIL_IF(!archive, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    for (i = searchPath; i != NULL; i = i->next)
    {
        if ((i->dirName != NULL) && (strcmp(archive, i->dirName) == 0))
        {
            if (!subdir || (strcmp(subdir, "/") == 0))
            {
                if (i->root)
                    allocator.Free(i->root);
                i->root = NULL;
                i->rootlen = 0;
            } /* if */
            else
            {
                const size_t len = strlen(subdir) + 1;
                char *ptr = (char *) allocator.Malloc(len);
                BAIL_IF_MUTEX(!ptr, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
                if (!sanitizePlatformIndependentPath(subdir, ptr))
                {
                    allocator.Free(ptr);
                    BAIL_MUTEX_ERRPASS(stateLock, 0);
                } /* if */

                if (i->root)
                    allocator.Free(i->root);
                i->root = ptr;
                i->rootlen = len;

                if (longest_root < len)
                    longest_root = len;
            } /* else */

            break;
        } /* if */
    } /* for */

    __PHYSFS_platformReleaseMutex(stateLock);
    return 1;
}